

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall
SQCompilation::CheckerVisitor::visitDestructuringDecl(CheckerVisitor *this,DestructuringDecl *d)

{
  SQUnsignedInteger *pSVar1;
  Expr *pEVar2;
  SQArray *this_00;
  char *__s;
  VarDecl *pVVar3;
  mapped_type pVVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  ValueRef *pVVar8;
  ulong uVar9;
  size_t __n;
  int *piVar10;
  mapped_type *ppVVar11;
  SQChar *pSVar12;
  size_t sVar13;
  int *piVar14;
  SQClass *pSVar15;
  VarDecl **ppVVar16;
  long lVar17;
  long lVar18;
  SQObjectPtr val;
  SQObjectPtr key;
  SQObject local_78;
  SQClass *local_60;
  _Map_base<const_SQCompilation::Node_*,_std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::Node_*>,_std::hash<const_SQCompilation::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_58;
  _Map_base<const_SQCompilation::Node_*,_std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::Node_*>,_std::hash<const_SQCompilation::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_50;
  SQObject local_48;
  VarDecl *local_38;
  
  checkAccessNullable(this,d);
  (*(this->super_Visitor)._vptr_Visitor[0x29])(this,d);
  pVVar8 = findValueForExpr(this,d->_expr);
  if (pVVar8 == (ValueRef *)0x0) {
    return;
  }
  if (1 < pVVar8->state - VRS_EXPRESSION) {
    return;
  }
  pEVar2 = pVVar8->expression;
  if (pEVar2 == (Expr *)0x0) {
    return;
  }
  if ((pEVar2->super_Node)._op != TO_EXTERNAL_VALUE) {
    return;
  }
  iVar7 = *(int *)&pEVar2[1].super_Node.super_ArenaObj._vptr_ArenaObj;
  if (iVar7 < 0x8004000) {
    if (iVar7 == 0x1000001) {
      uVar9 = (ulong)(d->super_DeclGroup)._decls._size;
      if (uVar9 != 0) {
        ppVVar16 = (d->super_DeclGroup)._decls._vals;
        lVar17 = 0;
        do {
          checkDestructuredVarDefault(this,*(VarDecl **)((long)ppVVar16 + lVar17));
          lVar17 = lVar17 + 8;
        } while (uVar9 << 3 != lVar17);
      }
      return;
    }
    if (iVar7 == 0x8000040) {
      if (d->_dt_type == DT_ARRAY) {
        uVar9 = (ulong)(d->super_DeclGroup)._decls._size;
        if (uVar9 == 0) {
          return;
        }
        this_00 = *(SQArray **)&pEVar2[1].super_Node._coordinates;
        pSVar15 = (SQClass *)(d->super_DeclGroup)._decls._vals;
        local_58 = (_Map_base<const_SQCompilation::Node_*,_std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::Node_*>,_std::hash<const_SQCompilation::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->astValues;
        lVar18 = uVar9 << 3;
        lVar17 = 0;
        local_60 = pSVar15;
        do {
          pVVar3 = *(VarDecl **)((long)pSVar15 + lVar17 * 8);
          local_48._unVal.pTable = (SQTable *)0x0;
          local_48._0_8_ = (VarDecl *)0x1000001;
          bVar5 = SQArray::Get(this_00,lVar17,(SQObjectPtr *)&local_48);
          if (bVar5) {
            local_78._0_8_ = pVVar3;
            ppVVar11 = std::__detail::
                       _Map_base<const_SQCompilation::Node_*,_std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::Node_*>,_std::hash<const_SQCompilation::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[](local_58,(key_type *)&local_78);
            pVVar4 = *ppVVar11;
            pVVar4->state = VRS_INITIALIZED;
            pVVar8 = addExternalValue(this,&local_48,(Node *)pVVar3);
            pVVar4->expression = pVVar8->expression;
            pSVar15 = local_60;
          }
          else {
            checkDestructuredVarDefault(this,pVVar3);
          }
          lVar17 = lVar17 + 1;
          SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_48);
          lVar18 = lVar18 + -8;
        } while (lVar18 != 0);
        return;
      }
      pSVar12 = "array";
      goto LAB_00159354;
    }
  }
  else {
    if (iVar7 == 0x8004000) {
      if (d->_dt_type == DT_TABLE) {
        uVar9 = (ulong)(d->super_DeclGroup)._decls._size;
        if (uVar9 == 0) {
          return;
        }
        local_60 = *(SQClass **)&pEVar2[1].super_Node._coordinates;
        local_58 = (_Map_base<const_SQCompilation::Node_*,_std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::Node_*>,_std::hash<const_SQCompilation::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)(d->super_DeclGroup)._decls._vals;
        local_50 = (_Map_base<const_SQCompilation::Node_*,_std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::Node_*>,_std::hash<const_SQCompilation::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->astValues;
        lVar17 = 0;
        do {
          pVVar3 = *(VarDecl **)((long)local_58 + lVar17);
          SQObjectPtr::SQObjectPtr
                    ((SQObjectPtr *)&local_48,this->_ctx->_vm,(pVVar3->super_ValueDecl)._name,-1);
          local_78._unVal.pTable = (SQTable *)0x0;
          local_78._0_8_ = (VarDecl *)0x1000001;
          bVar5 = SQClass::Get(local_60,(SQObjectPtr *)&local_48,(SQObjectPtr *)&local_78);
          if (bVar5) {
            local_38 = pVVar3;
            ppVVar11 = std::__detail::
                       _Map_base<const_SQCompilation::Node_*,_std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::Node_*>,_std::hash<const_SQCompilation::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[](local_50,(key_type *)&local_38);
            pVVar4 = *ppVVar11;
            pVVar4->state = VRS_INITIALIZED;
            pVVar8 = addExternalValue(this,&local_78,(Node *)pVVar3);
            pVVar4->expression = pVVar8->expression;
          }
          else {
            checkDestructuredVarDefault(this,pVVar3);
          }
          SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_78);
          SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_48);
          lVar17 = lVar17 + 8;
        } while (uVar9 << 3 != lVar17);
        return;
      }
      pSVar12 = "class";
      goto LAB_00159354;
    }
    if (iVar7 == 0xa000020) {
      if (d->_dt_type == DT_TABLE) {
        uVar9 = (ulong)(d->super_DeclGroup)._decls._size;
        if (uVar9 == 0) {
          return;
        }
        ppVVar16 = (d->super_DeclGroup)._decls._vals;
        local_60 = (SQClass *)(ppVVar16 + uVar9);
        local_58._0_4_ = pEVar2[1].super_Node._coordinates.lineStart;
        local_58._4_4_ = pEVar2[1].super_Node._coordinates.columnStart;
        local_50 = (_Map_base<const_SQCompilation::Node_*,_std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::Node_*>,_std::hash<const_SQCompilation::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->astValues;
        do {
          pVVar3 = *ppVVar16;
          local_78._unVal.pTable = (SQTable *)0x0;
          local_78._0_8_ = (VarDecl *)0x1000001;
          __s = (pVVar3->super_ValueDecl)._name;
          __n = strlen(__s);
          uVar6 = 0x84222325;
          if (__n != 0) {
            uVar6 = 0x84222325;
            sVar13 = __n;
            do {
              uVar6 = ((int)__s[sVar13 - 1] ^ uVar6) * 0x1b3;
              sVar13 = sVar13 + ~(__n >> 5);
            } while (__n >> 5 < sVar13);
          }
          piVar14 = (int *)((ulong)(uVar6 & *(uint *)((long)local_58 + 0x48)) * 0x28 +
                           *(long *)((long)local_58 + 0x40));
          do {
            if (((piVar14[4] == 0x8000010) && (*(size_t *)(*(long *)(piVar14 + 6) + 0x28) == __n))
               && (iVar7 = strncmp((char *)(*(long *)(piVar14 + 6) + 0x38),__s,__n), iVar7 == 0))
            goto LAB_0015954f;
            piVar14 = *(int **)(piVar14 + 8);
          } while (piVar14 != (int *)0x0);
          piVar14 = (int *)0x0;
LAB_0015954f:
          if (piVar14 == (int *)0x0) {
LAB_001595cb:
            checkDestructuredVarDefault(this,pVVar3);
          }
          else {
            piVar10 = piVar14;
            if (*piVar14 == 0x8010000) {
              piVar10 = (int *)(*(long *)(piVar14 + 2) + 0x18);
            }
            local_78._0_8_ = *(undefined8 *)piVar10;
            local_78._unVal = (SQObjectValue)((SQObjectValue *)(piVar10 + 2))->pTable;
            if ((local_78._0_8_ & 0x8000000) != 0) {
              pSVar1 = &((local_78._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                        super_SQRefCounted._uiRef;
              *pSVar1 = *pSVar1 + 1;
            }
            local_48._0_8_ = local_78._0_8_;
            local_48._unVal = local_78._unVal;
            if (piVar14 == (int *)0x0) goto LAB_001595cb;
            local_48._0_8_ = pVVar3;
            ppVVar11 = std::__detail::
                       _Map_base<const_SQCompilation::Node_*,_std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::Node_*>,_std::hash<const_SQCompilation::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[](local_50,(key_type *)&local_48);
            pVVar4 = *ppVVar11;
            pVVar4->state = VRS_INITIALIZED;
            pVVar8 = addExternalValue(this,&local_78,(Node *)pVVar3);
            pVVar4->expression = pVVar8->expression;
          }
          SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_78);
          ppVVar16 = ppVVar16 + 1;
          if ((SQClass *)ppVVar16 == local_60) {
            return;
          }
        } while( true );
      }
      pSVar12 = "table";
      goto LAB_00159354;
    }
    if (iVar7 == 0xa008000) {
      if (d->_dt_type == DT_TABLE) {
        uVar9 = (ulong)(d->super_DeclGroup)._decls._size;
        if (uVar9 == 0) {
          return;
        }
        local_60 = *(SQClass **)&pEVar2[1].super_Node._coordinates;
        local_58 = (_Map_base<const_SQCompilation::Node_*,_std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::Node_*>,_std::hash<const_SQCompilation::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)(d->super_DeclGroup)._decls._vals;
        local_50 = (_Map_base<const_SQCompilation::Node_*,_std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::Node_*>,_std::hash<const_SQCompilation::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->astValues;
        lVar17 = 0;
        do {
          pVVar3 = *(VarDecl **)((long)local_58 + lVar17);
          SQObjectPtr::SQObjectPtr
                    ((SQObjectPtr *)&local_48,this->_ctx->_vm,(pVVar3->super_ValueDecl)._name,-1);
          local_78._unVal.pTable = (SQTable *)0x0;
          local_78._0_8_ = (VarDecl *)0x1000001;
          bVar5 = SQInstance::Get((SQInstance *)local_60,(SQObjectPtr *)&local_48,
                                  (SQObjectPtr *)&local_78);
          if (bVar5) {
            local_38 = pVVar3;
            ppVVar11 = std::__detail::
                       _Map_base<const_SQCompilation::Node_*,_std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>,_std::allocator<std::pair<const_SQCompilation::Node_*const,_SQCompilation::ValueRef_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::Node_*>,_std::hash<const_SQCompilation::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[](local_50,(key_type *)&local_38);
            pVVar4 = *ppVVar11;
            pVVar4->state = VRS_INITIALIZED;
            pVVar8 = addExternalValue(this,&local_78,(Node *)pVVar3);
            pVVar4->expression = pVVar8->expression;
          }
          else {
            checkDestructuredVarDefault(this,pVVar3);
          }
          SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_78);
          SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_48);
          lVar17 = lVar17 + 8;
        } while (uVar9 << 3 != lVar17);
        return;
      }
      pSVar12 = "instance";
      goto LAB_00159354;
    }
  }
  pSVar12 = GetTypeName((SQObjectPtr *)(pEVar2 + 1));
LAB_00159354:
  report(this,(Node *)d,0x8d,pSVar12);
  return;
}

Assistant:

void CheckerVisitor::visitDestructuringDecl(DestructuringDecl *d) {

  checkAccessNullable(d);

  Visitor::visitDestructuringDecl(d);

  if (auto v = findValueForExpr(d->initExpression()); v && v->hasValue() && v->expression) {
    if (v->expression->op() == TO_EXTERNAL_VALUE) {
      const auto &init = v->expression->asExternal()->value();
      if (sq_isnull(init)) {
        for (auto var : d->declarations()) {
          checkDestructuredVarDefault(var);
        }
      }
      else if (sq_istable(init)) {
        if (d->type() == DT_TABLE) {
          auto table = _table(init);
          for (auto var : d->declarations()) {
            SQObjectPtr val;
            if (table->GetStr(var->name(), strlen(var->name()), val)) {
              auto vv = astValues[var];
              assert(vv);
              vv->state = VRS_INITIALIZED;
              vv->expression = addExternalValue(val, var)->expression;
            }
            else {
              checkDestructuredVarDefault(var);
            }
          }
        }
        else {
          report(d, DiagnosticsId::DI_DESTRUCTURED_TYPE_MISMATCH, "table");
        }
      }
      else if (sq_isclass(init)) {
        if (d->type() == DT_TABLE) {
          auto klass = _class(init);
          for (auto var : d->declarations()) {
            SQObjectPtr key(_ctx.getVm(), var->name());
            SQObjectPtr val;
            if (klass->Get(key, val)) {
              auto vv = astValues[var];
              assert(vv);
              vv->state = VRS_INITIALIZED;
              vv->expression = addExternalValue(val, var)->expression;
            }
            else {
              checkDestructuredVarDefault(var);
            }
          }
        }
        else {
          report(d, DiagnosticsId::DI_DESTRUCTURED_TYPE_MISMATCH, "class");
        }
      }
      else if (sq_isinstance(init)) {
        if (d->type() == DT_TABLE) {
          auto inst = _instance(init);
          for (auto var : d->declarations()) {
            SQObjectPtr key(_ctx.getVm(), var->name());
            SQObjectPtr val;
            if (inst->Get(key, val)) {
              auto vv = astValues[var];
              assert(vv);
              vv->state = VRS_INITIALIZED;
              vv->expression = addExternalValue(val, var)->expression;
            }
            else {
              checkDestructuredVarDefault(var);
            }
          }
        }
        else {
          report(d, DiagnosticsId::DI_DESTRUCTURED_TYPE_MISMATCH, "instance");
        }
      }
      else if (sq_isarray(init)) {
        if (d->type() == DT_ARRAY) {
          auto array = _array(init);
          SQInteger index = 0;
          for (auto var : d->declarations()) {
            SQObjectPtr val;
            if (array->Get(index, val)) {
              auto vv = astValues[var];
              assert(vv);
              vv->state = VRS_INITIALIZED;
              vv->expression = addExternalValue(val, var)->expression;
            }
            else {
              checkDestructuredVarDefault(var);
            }
            index++;
          }
        }
        else {
          report(d, DiagnosticsId::DI_DESTRUCTURED_TYPE_MISMATCH, "array");
        }
      }
      else {
        report(d, DiagnosticsId::DI_DESTRUCTURED_TYPE_MISMATCH, GetTypeName(init));
      }
    }
    else if (v->expression->op() == TO_TABLE) {
      // TODO: check table destructuring
    }
    else if (v->expression->op() == TO_ARRAYEXPR) {
      // TODO: check array destructuring
    }
  }
}